

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O0

int main(void)

{
  errno_t eVar1;
  undefined8 local_16;
  char s [10];
  
  s[2] = '\0';
  s[3] = '\0';
  s[4] = '\0';
  s[5] = '\0';
  local_16 = 0x7878787878787878;
  s[0] = 'x';
  s[1] = '\0';
  set_constraint_handler_s(test_handler);
  eVar1 = memset_s(&local_16,10,0x6f,10);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x3c,"memset_s( s, 10, \'o\', 10 ) == 0");
  }
  if (s[1] != 'o') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x3d,"s[9] == \'o\'");
  }
  eVar1 = memset_s(&local_16,10,0x5f,0);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x3e,"memset_s( s, 10, \'_\', ( 0 ) ) == 0");
  }
  if ((char)local_16 != 'o') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x3f,"s[0] == \'o\'");
  }
  eVar1 = memset_s(&local_16,10,0x5f,1);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x40,"memset_s( s, 10, \'_\', 1 ) == 0");
  }
  if ((char)local_16 != '_') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x41,"s[0] == \'_\'");
  }
  if (local_16._1_1_ != 'o') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x42,"s[1] == \'o\'");
  }
  if (HANDLER_CALLS != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset_s.c, line %d - %s\n"
           ,0x44,"HANDLER_CALLS == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( memset_s( s, 10, 'o', 10 ) == 0 );
    TESTCASE( s[9] == 'o' );
    TESTCASE( memset_s( s, 10, '_', ( 0 ) ) == 0 );
    TESTCASE( s[0] == 'o' );
    TESTCASE( memset_s( s, 10, '_', 1 ) == 0 );
    TESTCASE( s[0] == '_' );
    TESTCASE( s[1] == 'o' );

    TESTCASE( HANDLER_CALLS == 0 );
#endif
    return TEST_RESULTS;
}